

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O1

bool __thiscall QCborStreamWriterPrivate::closeContainer(QCborStreamWriterPrivate *this)

{
  qsizetype *pqVar1;
  undefined4 uVar2;
  int iVar3;
  size_t sVar4;
  anon_union_8_3_8ebc2b8a_for_data aVar5;
  uint8_t *puVar6;
  size_t sVar7;
  iterator iVar8;
  ssize_t sVar9;
  int iVar10;
  size_t in_RCX;
  QCborStreamWriterPrivate *that;
  long in_FS_OFFSET;
  bool bVar11;
  undefined1 local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->containerStack).super_QList<CborEncoder>.d.size == 0) {
    closeContainer();
    bVar11 = false;
  }
  else {
    iVar8 = QList<CborEncoder>::end(&(this->containerStack).super_QList<CborEncoder>);
    sVar4 = iVar8.i[-1].remaining;
    iVar3 = iVar8.i[-1].flags;
    uVar2 = *(undefined4 *)&iVar8.i[-1].field_0x1c;
    pqVar1 = &(this->containerStack).super_QList<CborEncoder>.d.size;
    *pqVar1 = *pqVar1 + -1;
    aVar5 = (this->encoder).data;
    puVar6 = (this->encoder).end;
    if (((this->encoder).flags & 0x10) == 0) {
      sVar7 = (this->encoder).remaining;
      if (sVar7 == 1) {
        iVar10 = (uint)(puVar6 == (uint8_t *)0x0) << 0x1f;
      }
      else {
        iVar10 = 0x301 - (uint)(sVar7 == 0);
      }
    }
    else {
      local_31 = 0xff;
      if (*(QIODevice **)puVar6 == (QIODevice *)0x0) {
        iVar10 = 0;
      }
      else {
        sVar9 = QIODevice::write(*(QIODevice **)puVar6,(int)&local_31,(void *)0x1,in_RCX);
        iVar10 = (uint)(sVar9 != 1) << 2;
      }
    }
    (this->encoder).data = aVar5;
    (this->encoder).end = puVar6;
    (this->encoder).remaining = sVar4;
    (this->encoder).flags = iVar3;
    *(undefined4 *)&(this->encoder).field_0x1c = uVar2;
    bVar11 = iVar10 == 0;
    if (!bVar11) {
      if (iVar10 == 0x300) {
        closeContainer();
      }
      else if (iVar10 == 0x301) {
        closeContainer();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool closeContainer()
    {
        if (containerStack.isEmpty()) {
            qWarning("QCborStreamWriter: closing map or array that wasn't open");
            return false;
        }

        CborEncoder container = containerStack.pop();
        CborError err = cbor_encoder_close_container(&container, &encoder);
        encoder = container;

        if (Q_UNLIKELY(err)) {
            if (err == CborErrorTooFewItems)
                qWarning("QCborStreamWriter: not enough items added to array or map");
            else if (err == CborErrorTooManyItems)
                qWarning("QCborStreamWriter: too many items added to array or map");
            return false;
        }

        return true;
    }